

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IffAtcNavAidsLayer1Pdu.cpp
# Opt level: O3

void __thiscall
DIS::IffAtcNavAidsLayer1Pdu::marshal(IffAtcNavAidsLayer1Pdu *this,DataStream *dataStream)

{
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_emittingEntityId,dataStream);
  EventID::marshal(&this->_eventID,dataStream);
  Vector3Float::marshal(&this->_location,dataStream);
  SystemID::marshal(&this->_systemID,dataStream);
  DataStream::operator<<(dataStream,this->_pad2);
  IffFundamentalData::marshal(&this->_fundamentalParameters,dataStream);
  return;
}

Assistant:

void IffAtcNavAidsLayer1Pdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _emittingEntityId.marshal(dataStream);
    _eventID.marshal(dataStream);
    _location.marshal(dataStream);
    _systemID.marshal(dataStream);
    dataStream << _pad2;
    _fundamentalParameters.marshal(dataStream);
}